

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void __thiscall QFormLayoutPrivate::QFormLayoutPrivate(QFormLayoutPrivate *this)

{
  QLayoutPrivate::QLayoutPrivate(&this->super_QLayoutPrivate);
  *(undefined ***)&this->super_QLayoutPrivate = &PTR__QFormLayoutPrivate_007ec750;
  *(uint *)&this->field_0xb0 = (uint)(byte)this->field_0xb3 << 0x18 | 0x14ffff;
  this->labelAlignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x0;
  this->formAlignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x0;
  (this->m_matrix).m_storage.d.d = (Data *)0x0;
  (this->m_matrix).m_storage.d.ptr = (QFormLayoutItem **)0x0;
  (this->m_matrix).m_storage.d.size = 0;
  (this->m_things).d.d = (Data *)0x0;
  (this->m_things).d.ptr = (QFormLayoutItem **)0x0;
  (this->m_things).d.size = 0;
  this->layoutWidth = -1;
  this->hfw_width = -1;
  this->hfw_height = -1;
  this->hfw_sh_height = -1;
  this->hfw_sh_height = -1;
  this->hfw_sh_minheight = -1;
  this->min_width = -1;
  this->sh_width = -1;
  this->thresh_width = 0x7ffff;
  (this->minSize).wd.m_i = -1;
  (this->minSize).ht.m_i = -1;
  (this->prefSize).wd.m_i = -1;
  (this->prefSize).ht.m_i = -1;
  (this->vLayouts).d.d = (Data *)0x0;
  (this->vLayouts).d.ptr = (QLayoutStruct *)0x0;
  (this->vLayouts).d.size = 0;
  (this->hfwLayouts).d.d = (Data *)0x0;
  (this->hfwLayouts).d.ptr = (QLayoutStruct *)0x0;
  (this->hfwLayouts).d.size = 0;
  this->hSpacing = -1;
  this->vSpacing = -1;
  return;
}

Assistant:

QFormLayoutPrivate::QFormLayoutPrivate()
    : fieldGrowthPolicy(DefaultFieldGrowthPolicy),
      rowWrapPolicy(DefaultRowWrapPolicy), has_hfw(false), dirty(true), sizesDirty(true),
      expandVertical(0), expandHorizontal(0)
{
}